

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::WeightParams::WeightParams(WeightParams *this,WeightParams *from)

{
  int new_size;
  void *pvVar1;
  string *psVar2;
  QuantizationParams *from_00;
  QuantizationParams *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__WeightParams_003d3490;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->floatvalue_).current_size_ = 0;
  (this->floatvalue_).total_size_ = 0;
  (this->floatvalue_).rep_ = (Rep *)0x0;
  new_size = (from->floatvalue_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&this->floatvalue_,new_size);
    memcpy(((this->floatvalue_).rep_)->elements,((from->floatvalue_).rep_)->elements,
           (long)(from->floatvalue_).current_size_ << 2);
    (this->floatvalue_).current_size_ = (from->floatvalue_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->float16value_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->float16value_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->float16value_,psVar2);
  }
  (this->rawvalue_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->rawvalue_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->rawvalue_,psVar2);
  }
  (this->int8rawvalue_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->int8rawvalue_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->int8rawvalue_,psVar2);
  }
  from_00 = from->quantization_;
  if (from_00 == (QuantizationParams *)0x0 ||
      from == (WeightParams *)&_WeightParams_default_instance_) {
    this_00 = (QuantizationParams *)0x0;
  }
  else {
    this_00 = (QuantizationParams *)operator_new(0x28);
    QuantizationParams::QuantizationParams(this_00,from_00);
  }
  this->quantization_ = this_00;
  this->isupdatable_ = from->isupdatable_;
  return;
}

Assistant:

WeightParams::WeightParams(const WeightParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      floatvalue_(from.floatvalue_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  float16value_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.float16value().size() > 0) {
    float16value_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.float16value_);
  }
  rawvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.rawvalue().size() > 0) {
    rawvalue_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.rawvalue_);
  }
  int8rawvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.int8rawvalue().size() > 0) {
    int8rawvalue_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.int8rawvalue_);
  }
  if (from.has_quantization()) {
    quantization_ = new ::CoreML::Specification::QuantizationParams(*from.quantization_);
  } else {
    quantization_ = NULL;
  }
  isupdatable_ = from.isupdatable_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.WeightParams)
}